

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkAbstractNodes(Wlc_Ntk_t *p,Vec_Int_t *vNodesInit)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *__ptr;
  long lVar4;
  int *piVar5;
  Wlc_Obj_t *pWVar6;
  Wlc_Ntk_t *pWVar7;
  int iVar8;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar9;
  ulong uVar10;
  ulong uVar11;
  
  __ptr = vNodesInit;
  if (vNodesInit == (Vec_Int_t *)0x0) {
    __ptr = Wlc_NtkCollectMultipliers(p);
  }
  if (__ptr == (Vec_Int_t *)0x0) {
    return (Wlc_Ntk_t *)0x0;
  }
  if (0 < __ptr->nSize) {
    lVar4 = 0;
    do {
      iVar3 = __ptr->pArray[lVar4];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0037adeb;
      *(ushort *)(p->pObjs + iVar3) = *(ushort *)(p->pObjs + iVar3) | 0x80;
      lVar4 = lVar4 + 1;
    } while (lVar4 < __ptr->nSize);
  }
  uVar2 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar2) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar2 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar2 << 2);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    memset((p->vCopies).pArray,0,(ulong)uVar2 * 4);
  }
  (p->vCopies).nSize = uVar2;
  if (1 < p->iObj) {
    uVar11 = 1;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar11) {
LAB_0037adeb:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if (uVar11 == (uint)(p->vCopies).nSize) break;
      pWVar6 = p->pObjs + uVar11;
      uVar1 = *(ushort *)pWVar6;
      if ((char)uVar1 < '\0') {
        *(ushort *)pWVar6 = uVar1 & 0xff7f;
        iVar8 = pWVar6->End - pWVar6->Beg;
        iVar3 = -iVar8;
        if (0 < iVar8) {
          iVar3 = iVar8;
        }
        iVar3 = Wlc_ObjAlloc(p,1,uVar1 >> 6 & 1,iVar3,0);
      }
      else {
        uVar10 = (ulong)pWVar6->nFanins;
        if (0 < (int)pWVar6->nFanins) {
          lVar4 = 0;
          do {
            if ((2 < (uint)uVar10) ||
               (paVar9 = &pWVar6->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar6->field_10).pFanins[0];
            }
            iVar3 = paVar9->Fanins[lVar4];
            if (((long)iVar3 < 0) || ((p->vCopies).nSize <= iVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if ((2 < (uint)uVar10) ||
               (paVar9 = &pWVar6->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar6 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar9 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar6->field_10).pFanins[0];
            }
            paVar9->Fanins[lVar4] = (p->vCopies).pArray[iVar3];
            lVar4 = lVar4 + 1;
            uVar10 = (ulong)(int)pWVar6->nFanins;
          } while (lVar4 < (long)uVar10);
        }
        iVar3 = (int)uVar11;
      }
      if ((long)(p->vCopies).nSize <= (long)uVar11) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[uVar11] = iVar3;
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->iObj);
  }
  if (__ptr != vNodesInit) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
  }
  pWVar7 = Wlc_NtkDupDfs(p,0,1);
  return pWVar7;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkAbstractNodes( Wlc_Ntk_t * p, Vec_Int_t * vNodesInit )
{
    Vec_Int_t * vNodes = vNodesInit;
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    int i, k, iObj, iFanin;
    // get multipliers if not given
    if ( vNodes == NULL )
        vNodes = Wlc_NtkCollectMultipliers( p );
    if ( vNodes == NULL )
        return NULL;
    // mark nodes
    Wlc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->Mark = 1;
    // iterate through the nodes in the DFS order
    Wlc_NtkCleanCopy( p );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( i == Vec_IntSize(&p->vCopies) )
            break;
        if ( pObj->Mark ) {
            // clean
            pObj->Mark = 0;
            // add fresh PI with the same number of bits
            iObj = Wlc_ObjAlloc( p, WLC_OBJ_PI, Wlc_ObjIsSigned(pObj), Wlc_ObjRange(pObj) - 1, 0 );
        }
        else {
            // update fanins 
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                Wlc_ObjFanins(pObj)[k] = Wlc_ObjCopy(p, iFanin);
            // node to remain
            iObj = i;
        }
        Wlc_ObjSetCopy( p, i, iObj );
    }
    // POs do not change in this procedure
    if ( vNodes != vNodesInit )
        Vec_IntFree( vNodes );
    // reconstruct topological order
    pNew = Wlc_NtkDupDfs( p, 0, 1 );
    return pNew;
}